

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckTypedefs(Parser *this,char *regEx,bool alignment,uint maxLength)

{
  string *this_00;
  size_t pos_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long local_370;
  size_t pos;
  int local_35c;
  ulong local_358;
  Error error;
  size_t typedefpos;
  size_t beg;
  size_t local_308;
  string previousLine;
  string var;
  string currentLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  RegularExpression regex;
  
  local_35c = (int)CONCAT71(in_register_00000011,alignment);
  if (local_35c != 0) {
    this->m_TestsDone[0x10] = true;
    pcVar3 = (char *)operator_new__(0xff);
    builtin_strncpy(pcVar3,"Typedefs should be aligned",0x1b);
    std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x10));
    operator_delete__(pcVar3);
  }
  this->m_TestsDone[0xf] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0xf));
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0xf));
  kwssys::RegularExpression::RegularExpression(&regex,regEx);
  pos = 0;
  local_358 = (ulong)maxLength;
  sVar4 = 0;
  local_370 = 0;
  bVar2 = 0;
  sVar11 = 0;
  do {
    if (sVar4 == 0xffffffffffffffff) {
      kwssys::RegularExpression::~RegularExpression(&regex);
      return (bool)(~bVar2 & 1);
    }
    beg = 0;
    typedefpos = 0;
    FindTypedef_abi_cxx11_
              (&var,this,sVar4 + 1,(this->m_BufferNoComment)._M_string_length,&pos,&beg,&typedefpos)
    ;
    pos_00 = beg;
    sVar4 = pos;
    sVar10 = sVar11;
    if (var._M_string_length != 0) {
      if ((char)local_35c != '\0') {
        sVar4 = GetPositionInLine(this,beg);
        lVar5 = GetLineNumber(this,pos_00,true);
        lVar6 = GetLineNumber(this,typedefpos,true);
        uVar7 = lVar6 - local_370;
        sVar10 = sVar4;
        local_370 = lVar5;
        if ((uVar7 < 2) && (sVar10 = sVar11, local_308 = sVar4, sVar11 - sVar4 != 0)) {
          lVar5 = GetLineNumber(this,pos_00,true);
          GetLine_abi_cxx11_(&previousLine,this,lVar5 - 2);
          lVar5 = GetLineNumber(this,pos_00,true);
          sVar10 = local_308;
          GetLine_abi_cxx11_(&currentLine,this,lVar5 - 1);
          uVar7 = (sVar11 - sVar4) + currentLine._M_string_length;
          if (local_358 < uVar7) {
            sVar11 = sVar4;
          }
          sVar9 = sVar10;
          do {
            uVar8 = (ulong)(sVar4 != 0);
            if (sVar9 < 2) break;
            lVar5 = sVar9 - 1;
            uVar8 = sVar9;
            sVar9 = sVar9 - 1;
          } while (currentLine._M_dataplus._M_p[lVar5] == ' ');
          uVar8 = (previousLine._M_string_length - sVar11) + uVar8 + 1;
          if (uVar8 <= local_358) {
            sVar4 = sVar11;
          }
          this_00 = &error.description;
          if ((uVar7 <= local_358 &&
              (currentLine._M_string_length + previousLine._M_string_length <= local_358 ||
              previousLine._M_dataplus._M_p[previousLine._M_string_length - 1] == ';')) &&
              uVar8 <= local_358) {
            error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
            error.description._M_string_length = 0;
            error.description.field_2._M_local_buf[0] = '\0';
            error.line = GetLineNumber(this,pos_00,true);
            error.number = 0x10;
            error.line2 = error.line;
            std::operator+(&local_2a0,"Type definition (",&var);
            std::operator+(&local_280,&local_2a0,") is not aligned with the previous one: ");
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_280);
            std::__cxx11::string::~string((string *)&local_280);
            std::__cxx11::string::~string((string *)&local_2a0);
            pcVar3 = (char *)operator_new__(10);
            snprintf(pcVar3,10,"%zd",sVar10);
            std::__cxx11::string::append((char *)this_00);
            std::__cxx11::string::append((char *)this_00);
            snprintf(pcVar3,10,"%zd",sVar4);
            std::__cxx11::string::append((char *)this_00);
            operator_delete__(pcVar3);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,&error);
            std::__cxx11::string::~string((string *)this_00);
            bVar2 = 1;
          }
          std::__cxx11::string::~string((string *)&currentLine);
          std::__cxx11::string::~string((string *)&previousLine);
          sVar10 = sVar4;
        }
      }
      bVar1 = kwssys::RegularExpression::find(&regex,var._M_dataplus._M_p);
      sVar4 = pos;
      if (!bVar1) {
        error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
        error.description._M_string_length = 0;
        error.description.field_2._M_local_buf[0] = '\0';
        error.line = GetLineNumber(this,pos,true);
        error.number = 0xf;
        error.line2 = error.line;
        std::operator+(&currentLine,"Type definition (",&var);
        std::operator+(&previousLine,&currentLine,") doesn\'t match regular expression");
        std::__cxx11::string::operator=((string *)&error.description,(string *)&previousLine);
        std::__cxx11::string::~string((string *)&previousLine);
        std::__cxx11::string::~string((string *)&currentLine);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,&error);
        std::__cxx11::string::~string((string *)&error.description);
        bVar2 = 1;
      }
    }
    std::__cxx11::string::~string((string *)&var);
    sVar11 = sVar10;
  } while( true );
}

Assistant:

bool Parser::CheckTypedefs(const char* regEx, bool alignment,unsigned int maxLength)
{
  if(alignment)
    {
    m_TestsDone[TYPEDEF_ALIGN] = true;
    constexpr size_t length = 255;
    char* val = new char[length];
    snprintf(val,length,"Typedefs should be aligned");
    m_TestsDescription[TYPEDEF_ALIGN] = val;
    delete [] val;
    }

  m_TestsDone[TYPEDEF_REGEX] = true;
  m_TestsDescription[TYPEDEF_REGEX] = "Typedefs should match regular expression: ";
  m_TestsDescription[TYPEDEF_REGEX] += regEx;

  // First we need to find the typedefs
  // typedef type MyTypeDef;
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  size_t previousline = 0;
  size_t previouspos = 0;
  size_t pos = 0;
  while(pos!= std::string::npos)
    {
    size_t beg = 0;
    size_t typedefpos = 0;
    std::string var = this->FindTypedef(pos+1,m_BufferNoComment.size(),pos,beg,typedefpos);

    if (var.empty()) {
      continue;
    }
    // Check the alignment if specified
    if(alignment)
      {
      // Find the position in the line
      size_t l = this->GetPositionInLine(beg);
      size_t line = this->GetLineNumber(beg,true);
      size_t typdefline = this->GetLineNumber(typedefpos,true);

      // if the typedef is on a line close to the previous one we check
      if(typdefline-previousline<2)
        {
        if(l!=previouspos)
          {
          bool reportError = true;
          // We check that the previous line is not ending with a semicolon
          // and that the sum of the two lines is more than maxLength
          std::string previousLine = this->GetLine(this->GetLineNumber(beg,true)-2);
          std::string currentLine = this->GetLine(this->GetLineNumber(beg,true)-1);
          if( (previousLine[previousLine.size()-1] != ';')
             && (previousLine.size()+currentLine.size()>maxLength)
            )
            {
            reportError = false;
            }

          // Check if the alignement is possible due to the length of the line
          size_t size = currentLine.size()-l;
          if(previouspos+size>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          // This one is a bit tricky. Check the minimum
          // typedef igstk::VascularNetworkObject   VascularNetworkObjectType;
          // typedef VascularNetworkObjectType::VesselObjectType VesselObjectType;
          // First find the optimal position (one space) for the current line
          size_t optimalCurrentLinePos = l;
          while(optimalCurrentLinePos>1 && currentLine[optimalCurrentLinePos-1] == ' ')
            {
            optimalCurrentLinePos--;
            }
          optimalCurrentLinePos++;
          // Second find the size of the previous typedefs;
          size_t sizeTypedef = previousLine.size()-previouspos;
          // if the size is too big we don't report
          if(optimalCurrentLinePos+sizeTypedef>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          if(reportError)
            {
            Error error;
            error.line = this->GetLineNumber(beg,true);
            error.line2 = error.line;
            error.number = TYPEDEF_ALIGN;
            error.description = "Type definition (" + var + ") is not aligned with the previous one: ";
            constexpr size_t length = 10;
            char* localvar = new char[length];
            snprintf(localvar,length,"%zd",l);
            error.description += localvar;
            error.description += " v.s. ";
            snprintf(localvar,length,"%zd",previouspos);
            error.description += localvar;
            delete [] localvar;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      else
        {
        previouspos = l;
        }
      previousline = line;
      }

    if(!regex.find(var))
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = TYPEDEF_REGEX;
      error.description = "Type definition (" + var + ") doesn't match regular expression";
      m_ErrorList.push_back(error);
      hasError = true;
      }
    }
  return !hasError;
}